

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementForm.cpp
# Opt level: O1

void __thiscall Rml::ElementForm::Submit(ElementForm *this,String *name,String *submit_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  type pVVar4;
  ElementFormControl *this_00;
  iterator iVar5;
  long *plVar6;
  Variant *this_01;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  String control_name;
  ElementList form_controls;
  Dictionary values;
  String control_value;
  String local_138;
  ElementList local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Dictionary local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  String local_78;
  String local_58;
  Element *local_38;
  
  local_d8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)0x0;
  local_d8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (name->_M_string_length == 0) {
    pVVar4 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[7]>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)&local_d8,(char (*) [7])"submit");
    Variant::Clear(pVVar4);
  }
  else {
    pVVar4 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<std::__cxx11::string_const&>
                       ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                         *)&local_d8,name);
    Variant::Clear(pVVar4);
  }
  Variant::Set(pVVar4,submit_value);
  local_118.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"input","");
  ElementUtilities::GetElementsByTagName(&local_118,&this->super_Element,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_138._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"textarea","");
  ElementUtilities::GetElementsByTagName(&local_118,&this->super_Element,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_138._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"select","");
  ElementUtilities::GetElementsByTagName(&local_118,&this->super_Element,&local_138);
  local_38 = &this->super_Element;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_118.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_118.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      if (local_118.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] == (Element *)0x0) {
        this_00 = (ElementFormControl *)0x0;
      }
      else {
        this_00 = (ElementFormControl *)
                  __dynamic_cast(local_118.
                                 super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar9],&Element::typeinfo
                                 ,&ElementFormControl::typeinfo,0);
      }
      if (((this_00 != (ElementFormControl *)0x0) &&
          (bVar2 = ElementFormControl::IsDisabled(this_00), !bVar2)) &&
         (iVar3 = (*(this_00->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable
                    [0x1a])(this_00), (char)iVar3 != '\0')) {
        ElementFormControl::GetName_abi_cxx11_(&local_138,this_00);
        (*(this_00->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x18])
                  (&local_58,this_00);
        if (local_138._M_string_length != 0) {
          iVar5 = itlib::
                  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                  ::find<std::__cxx11::string>
                            ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                              *)&local_d8,&local_138);
          this_01 = &(iVar5._M_current)->second;
          if (iVar5._M_current ==
              local_d8.m_container.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pVVar4 = itlib::
                     flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                     ::operator[]<std::__cxx11::string&>
                               ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                                 *)&local_d8,&local_138);
            Variant::Clear(pVVar4);
            Variant::Set(pVVar4,&local_58);
          }
          else {
            paVar1 = &local_f8.field_2;
            local_f8._M_string_length = 0;
            local_f8.field_2._M_local_buf[0] = '\0';
            local_f8._M_dataplus._M_p = (pointer)paVar1;
            Variant::
            GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (this_01,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p == paVar1) {
              local_88._8_8_ = local_f8.field_2._8_8_;
              local_98 = &local_88;
            }
            else {
              local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_f8._M_dataplus._M_p;
            }
            local_88._M_allocated_capacity._1_7_ = local_f8.field_2._M_allocated_capacity._1_7_;
            local_88._M_local_buf[0] = local_f8.field_2._M_local_buf[0];
            local_90 = local_f8._M_string_length;
            local_f8._M_string_length = 0;
            local_f8.field_2._M_local_buf[0] = '\0';
            local_f8._M_dataplus._M_p = (pointer)paVar1;
            plVar6 = (long *)::std::__cxx11::string::append((char *)&local_98);
            local_b8 = &local_a8;
            plVar7 = plVar6 + 2;
            if ((long *)*plVar6 == plVar7) {
              local_a8 = *plVar7;
              lStack_a0 = plVar6[3];
            }
            else {
              local_a8 = *plVar7;
              local_b8 = (long *)*plVar6;
            }
            local_b0 = plVar6[1];
            *plVar6 = (long)plVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)&local_b8,(ulong)local_58._M_dataplus._M_p);
            psVar8 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_78.field_2._M_allocated_capacity = *psVar8;
              local_78.field_2._8_8_ = plVar6[3];
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            }
            else {
              local_78.field_2._M_allocated_capacity = *psVar8;
              local_78._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_78._M_string_length = plVar6[1];
            *plVar6 = (long)psVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            Variant::Clear(this_01);
            Variant::Set(this_01,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,local_a8 + 1);
            }
            if (local_98 != &local_88) {
              operator_delete(local_98,local_88._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,
                              CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                       local_f8.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)local_118.
                                   super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_118.
                                   super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  Element::DispatchEvent(local_38,Submit,&local_d8);
  if (local_118.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_d8.m_container);
  return;
}

Assistant:

void ElementForm::Submit(const String& name, const String& submit_value)
{
	Dictionary values;
	if (name.empty())
		values["submit"] = submit_value;
	else
		values[name] = submit_value;

	ElementList form_controls;
	ElementUtilities::GetElementsByTagName(form_controls, this, "input");
	ElementUtilities::GetElementsByTagName(form_controls, this, "textarea");
	ElementUtilities::GetElementsByTagName(form_controls, this, "select");

	for (size_t i = 0; i < form_controls.size(); i++)
	{
		ElementFormControl* control = rmlui_dynamic_cast<ElementFormControl*>(form_controls[i]);
		if (!control)
			continue;

		// Skip disabled controls.
		if (control->IsDisabled())
			continue;

		// Only process controls that should be submitted.
		if (!control->IsSubmitted())
			continue;

		String control_name = control->GetName();
		String control_value = control->GetValue();

		// Skip over unnamed form controls.
		if (control_name.empty())
			continue;

		// If the item already exists, append to it.
		Variant* value = GetIf(values, control_name);
		if (value != nullptr)
			*value = value->Get<String>() + ", " + control_value;
		else
			values[control_name] = control_value;
	}

	DispatchEvent(EventId::Submit, values);
}